

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_aggsig_combine_signatures
              (secp256k1_context *ctx,secp256k1_aggsig_context *aggctx,uchar *sig64,
              secp256k1_aggsig_partial_signature *partial,size_t n_sigs)

{
  uchar *puVar1;
  int iVar2;
  secp256k1_gej *a;
  int overflow;
  secp256k1_scalar s;
  secp256k1_ge final;
  int local_b4;
  uchar *local_b0;
  secp256k1_scalar local_a8;
  secp256k1_ge local_88;
  
  iVar2 = 0;
  if (aggctx->n_sigs == n_sigs) {
    local_a8.d[2] = 0;
    local_a8.d[3] = 0;
    local_a8.d[0] = 0;
    local_a8.d[1] = 0;
    local_b0 = sig64;
    if (n_sigs != 0) {
      do {
        secp256k1_scalar_set_b32((secp256k1_scalar *)&local_88,partial->data,&local_b4);
        if (local_b4 != 0) {
          return 0;
        }
        secp256k1_scalar_add(&local_a8,&local_a8,(secp256k1_scalar *)&local_88);
        partial = partial + 1;
        n_sigs = n_sigs - 1;
      } while (n_sigs != 0);
    }
    a = &aggctx->pubnonce_sum;
    iVar2 = secp256k1_gej_has_quad_y_var(a);
    if (iVar2 == 0) {
      secp256k1_gej_neg(a,a);
    }
    secp256k1_ge_set_gej(&local_88,a);
    secp256k1_fe_normalize_var(&local_88.x);
    puVar1 = local_b0;
    secp256k1_fe_get_b32(local_b0,&local_88.x);
    secp256k1_scalar_get_b32(puVar1 + 0x20,&local_a8);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int secp256k1_aggsig_combine_signatures(const secp256k1_context* ctx, secp256k1_aggsig_context* aggctx, unsigned char *sig64, const secp256k1_aggsig_partial_signature *partial, size_t n_sigs) {
    size_t i;
    secp256k1_scalar s;
    secp256k1_ge final;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(aggctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(partial != NULL);
    (void) ctx;

    if (n_sigs != aggctx->n_sigs) {
        return 0;
    }

    secp256k1_scalar_set_int(&s, 0);
    for (i = 0; i < n_sigs; i++) {
        secp256k1_scalar tmp;
        int overflow;
        secp256k1_scalar_set_b32(&tmp, partial[i].data, &overflow);
        if (overflow) {
            return 0;
        }
        secp256k1_scalar_add(&s, &s, &tmp);
    }

    /* If we need to negate the public nonce, everyone will
     * have negated their secret nonces in the previous step. */
    if (!secp256k1_gej_has_quad_y_var(&aggctx->pubnonce_sum)) {
        secp256k1_gej_neg(&aggctx->pubnonce_sum, &aggctx->pubnonce_sum);
    }

    secp256k1_ge_set_gej(&final, &aggctx->pubnonce_sum);
    secp256k1_fe_normalize_var(&final.x);
    secp256k1_fe_get_b32(sig64, &final.x);
    secp256k1_scalar_get_b32(sig64 + 32, &s);
    return 1;
}